

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

string * extractFileName2(string *__return_storage_ptr__,string *src,bool withExt)

{
  char cVar1;
  string local_80 [48];
  string local_50 [32];
  long local_30;
  size_t dirSep;
  size_t extSep;
  string *psStack_18;
  bool withExt_local;
  string *src_local;
  string *fileName;
  
  extSep._6_1_ = 0;
  extSep._7_1_ = withExt;
  psStack_18 = src;
  src_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)src);
  cVar1 = (char)__return_storage_ptr__;
  dirSep = std::__cxx11::string::find_last_of(cVar1,0x2e);
  local_30 = std::__cxx11::string::find_last_of(cVar1,0x2f);
  if (local_30 == -1) {
    local_30 = std::__cxx11::string::find_last_of(cVar1,0x5c);
  }
  if ((dirSep != 0xffffffffffffffff) && ((extSep._7_1_ & 1) == 0)) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_50);
    std::__cxx11::string::~string(local_50);
  }
  if (local_30 != -1) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_80,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_80);
    std::__cxx11::string::~string(local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

string extractFileName2(const string& src, const bool withExt)
{
    string fileName = src;

    const size_t extSep = fileName.find_last_of('.');
    size_t dirSep = fileName.find_last_of('/');

    if (dirSep == string::npos)
        dirSep = fileName.find_last_of('\\');

    if (extSep != string::npos && !withExt)
        fileName = fileName.substr(0, extSep);

    if (dirSep != string::npos)
        fileName = fileName.substr(dirSep + 1, fileName.size());

    return fileName;
}